

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O0

void __thiscall
fizplex::SimplexTest_EqualityRowLowerVarsOptimalSolution_Test::
~SimplexTest_EqualityRowLowerVarsOptimalSolution_Test
          (SimplexTest_EqualityRowLowerVarsOptimalSolution_Test *this)

{
  void *in_RDI;
  
  ~SimplexTest_EqualityRowLowerVarsOptimalSolution_Test
            ((SimplexTest_EqualityRowLowerVarsOptimalSolution_Test *)0x1d1578);
  operator_delete(in_RDI,0xc0);
  return;
}

Assistant:

TEST_F(SimplexTest, EqualityRowLowerVarsOptimalSolution) {
  lp.add_column(ColType::LowerBound, 1.0, inf, 2);
  lp.add_column(ColType::LowerBound, 1.0, inf, 1);
  lp.add_row(RowType::Equality, 3, 3, {1, 1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(4.0, z);
}